

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

bool __thiscall
QMimeDatabasePrivate::mimeInherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QString *in_stack_00000010;
  QString *in_stack_00000018;
  QMimeDatabasePrivate *in_stack_00000020;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffa8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar2 = inherits(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeDatabasePrivate::mimeInherits(const QString &mime, const QString &parent)
{
    QMutexLocker locker(&mutex);
    return inherits(mime, parent);
}